

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O0

QDebug qt_QMetaEnum_debugOperator(QDebug *dbg,qint64 value,QMetaObject *meta,char *name)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  QDebug *pQVar5;
  char *in_RCX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  bool scoped;
  char *key;
  char *scope;
  int verbosity;
  QMetaEnum me;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff08;
  char in_stack_ffffffffffffff0f;
  QMetaEnum *in_stack_ffffffffffffff10;
  QMetaEnum *in_stack_ffffffffffffff18;
  QDebug *in_stack_ffffffffffffff20;
  QDebug *this;
  QMetaObject *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  QMetaEnum *in_stack_ffffffffffffff38;
  QDebug *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDebugStateSaver::QDebugStateSaver
            ((QDebugStateSaver *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             (QDebug *)in_stack_ffffffffffffff28);
  QDebug::nospace(in_RSI);
  QMetaObject::indexOfEnumerator
            ((QMetaObject *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff28);
  QMetaObject::enumerator(in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20))
  ;
  uVar3 = QDebug::verbosity(in_RSI);
  if ((1 < (int)uVar3) &&
     (pcVar4 = QMetaEnum::scope(in_stack_ffffffffffffff10), pcVar4 != (char *)0x0)) {
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff38,in_RCX);
    QDebug::operator<<(in_stack_ffffffffffffff20,(char16_t *)in_stack_ffffffffffffff38);
  }
  pQVar5 = (QDebug *)
           QMetaEnum::valueToKey
                     (in_stack_ffffffffffffff38,
                      CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  this_00 = pQVar5;
  bVar2 = QMetaEnum::isScoped((QMetaEnum *)
                              CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  if ((bVar2 || (uVar3 & 1) != 0) || (pQVar5 == (QDebug *)0x0)) {
    this = in_RSI;
    QMetaEnum::enumName(in_stack_ffffffffffffff18);
    QDebug::operator<<(this_00,in_RCX);
    QDebug::operator<<(this,(char16_t *)this_00);
  }
  if (pQVar5 == (QDebug *)0x0) {
    in_stack_ffffffffffffff10 =
         (QMetaEnum *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,
                            CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f);
  }
  else {
    QDebug::operator<<(this_00,in_RCX);
  }
  QDebug::QDebug((QDebug *)in_RDI,in_RSI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)in_stack_ffffffffffffff10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug qt_QMetaEnum_debugOperator(QDebug &dbg, qint64 value, const QMetaObject *meta, const char *name)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const int verbosity = dbg.verbosity();
    if (verbosity >= QDebug::DefaultVerbosity) {
        if (const char *scope = me.scope())
            dbg << scope << u"::";
    }

    const char *key = me.valueToKey(static_cast<int>(value));
    const bool scoped = me.isScoped() || verbosity & 1;
    if (scoped || !key)
        dbg << me.enumName() << (!key ? u"(" : u"::");

    if (key)
        dbg << key;
    else
        dbg << value << ')';

    return dbg;
}